

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

bool __thiscall
Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::Initialize
          (PageSegmentBase<Memory::VirtualAllocWrapper> *this,DWORD allocFlags,
          bool excludeGuardPages)

{
  PageAllocatorBaseCommon *pPVar1;
  undefined4 *puVar2;
  HANDLE pVVar3;
  char *lpAddress;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  BOOL BVar7;
  HANDLE pVVar8;
  AllocatorType *pAVar9;
  undefined8 *in_FS_OFFSET;
  DWORD local_2c [2];
  DWORD oldProtect;
  
  pPVar1 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.allocator;
  pAVar9 = &pPVar1[-1].allocatorType;
  if (pPVar1 == (PageAllocatorBaseCommon *)0x0) {
    pAVar9 = (AllocatorType *)0x0;
  }
  if ((this->freePageCount != 0) &&
     ((this->super_SegmentBase<Memory::VirtualAllocWrapper>).segmentPageCount !=
      (ulong)(this->freePageCount + pAVar9[0x2e]))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x111,
                       "(freePageCount + this->GetAllocator()->secondaryAllocPageCount == this->segmentPageCount || freePageCount == 0)"
                       ,
                       "freePageCount + this->GetAllocator()->secondaryAllocPageCount == this->segmentPageCount || freePageCount == 0"
                      );
    if (!bVar5) goto LAB_0025620b;
    *puVar2 = 0;
  }
  bVar5 = SegmentBase<Memory::VirtualAllocWrapper>::Initialize
                    (&this->super_SegmentBase<Memory::VirtualAllocWrapper>,allocFlags,
                     excludeGuardPages);
  if (!bVar5) {
    return false;
  }
  if (this->freePageCount == 0) {
    return true;
  }
  pPVar1 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.allocator;
  pAVar9 = &pPVar1[-1].allocatorType;
  if (pPVar1 == (PageAllocatorBaseCommon *)0x0) {
    pAVar9 = (AllocatorType *)0x0;
  }
  pVVar3 = *(HANDLE *)(pAVar9 + 0x4a);
  pVVar8 = GetCurrentProcess();
  if (pVVar3 != pVVar8) {
    return true;
  }
  lpAddress = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).address;
  uVar6 = GetAvailablePageCount(this);
  BVar7 = VirtualProtect(lpAddress,(ulong)(uVar6 << 0xc),1,local_2c);
  if (BVar7 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x11c,"((0))","UNREACHED");
    if (bVar5) {
      *puVar2 = 0;
      return false;
    }
  }
  else {
    if (local_2c[0] == 4) {
      return true;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x11f,"(oldProtect == 0x04)","oldProtect == PAGE_READWRITE");
    if (bVar5) {
      *puVar2 = 0;
      return true;
    }
  }
LAB_0025620b:
  pcVar4 = (code *)invalidInstructionException();
  (*pcVar4)();
}

Assistant:

bool
PageSegmentBase<T>::Initialize(DWORD allocFlags, bool excludeGuardPages)
{
    Assert(freePageCount + this->GetAllocator()->secondaryAllocPageCount == this->segmentPageCount || freePageCount == 0);
    if (__super::Initialize(allocFlags, excludeGuardPages))
    {
        if (freePageCount != 0)
        {
            if (this->GetAllocator()->processHandle == GetCurrentProcess())
            {
                DWORD oldProtect;
                BOOL vpresult = VirtualProtect(this->address, this->GetAvailablePageCount() * AutoSystemInfo::PageSize, PAGE_NOACCESS, &oldProtect);
                if(vpresult == FALSE)
                {
                    Assert(UNREACHED);
                    return false;
                }
                Assert(oldProtect == PAGE_READWRITE);
            }
        }
        return true;
    }
    return false;
}